

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::MergeFrom
          (SimpleRecurrentLayerParams *this,SimpleRecurrentLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  ActivationParams *pAVar2;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xa629);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) &&
     (from->activation_ != (ActivationParams *)0x0)) {
    if (this->activation_ == (ActivationParams *)0x0) {
      pAVar2 = (ActivationParams *)operator_new(0x20);
      ActivationParams::ActivationParams(pAVar2);
      this->activation_ = pAVar2;
    }
    pAVar2 = from->activation_;
    if (pAVar2 == (ActivationParams *)0x0) {
      pAVar2 = (ActivationParams *)&_ActivationParams_default_instance_;
    }
    ActivationParams::MergeFrom(this->activation_,pAVar2);
  }
  if ((from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) &&
     (from->weightmatrix_ != (WeightParams *)0x0)) {
    if (this->weightmatrix_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->weightmatrix_ = pWVar3;
    }
    pWVar3 = from->weightmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->weightmatrix_,pWVar3);
  }
  if ((from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) &&
     (from->recursionmatrix_ != (WeightParams *)0x0)) {
    if (this->recursionmatrix_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->recursionmatrix_ = pWVar3;
    }
    pWVar3 = from->recursionmatrix_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->recursionmatrix_,pWVar3);
  }
  if ((from != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) &&
     (from->biasvector_ != (WeightParams *)0x0)) {
    if (this->biasvector_ == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar3);
      this->biasvector_ = pWVar3;
    }
    pWVar3 = from->biasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->biasvector_,pWVar3);
  }
  if (from->inputvectorsize_ != 0) {
    this->inputvectorsize_ = from->inputvectorsize_;
  }
  if (from->outputvectorsize_ != 0) {
    this->outputvectorsize_ = from->outputvectorsize_;
  }
  if (from->sequenceoutput_ == true) {
    this->sequenceoutput_ = true;
  }
  if (from->hasbiasvector_ == true) {
    this->hasbiasvector_ = true;
  }
  if (from->reverseinput_ == true) {
    this->reverseinput_ = true;
  }
  return;
}

Assistant:

void SimpleRecurrentLayerParams::MergeFrom(const SimpleRecurrentLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SimpleRecurrentLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_activation()) {
    mutable_activation()->::CoreML::Specification::ActivationParams::MergeFrom(from.activation());
  }
  if (from.has_weightmatrix()) {
    mutable_weightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.weightmatrix());
  }
  if (from.has_recursionmatrix()) {
    mutable_recursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.recursionmatrix());
  }
  if (from.has_biasvector()) {
    mutable_biasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.biasvector());
  }
  if (from.inputvectorsize() != 0) {
    set_inputvectorsize(from.inputvectorsize());
  }
  if (from.outputvectorsize() != 0) {
    set_outputvectorsize(from.outputvectorsize());
  }
  if (from.sequenceoutput() != 0) {
    set_sequenceoutput(from.sequenceoutput());
  }
  if (from.hasbiasvector() != 0) {
    set_hasbiasvector(from.hasbiasvector());
  }
  if (from.reverseinput() != 0) {
    set_reverseinput(from.reverseinput());
  }
}